

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawEyelid(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  std::operator<<(out,"M ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  dVar2 = height * 0.5 + y;
  std::ostream::_M_insert<double>(dVar2);
  std::operator<<(out," Q ");
  dVar3 = width * 0.5 + x;
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(height + y);
  std::operator<<(out," ");
  poVar1 = std::ostream::_M_insert<double>(width + x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar2);
  std::operator<<(out," Q ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(dVar2);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawEyelid(ostream& out, double x, double y, double width,
		double height) {
	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M "  << x           << " " << y+height/2.0;
	out << " Q " << x+width/2.0 << " " << y+height;
	out << " "   << x+width     << " " << y+height/2.0;
	out << " Q " << x+width/2.0 << " " << y;
	out << " "   << x           << " " << y+height/2.0;
	out << " z\"";
	out << "/>\n";
}